

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  int p1;
  int iVar1;
  undefined4 in_ECX;
  int in_EDX;
  char *pcVar2;
  long in_RSI;
  Parse *in_RDI;
  char *z;
  i64 value;
  int c;
  int i;
  Vdbe *v;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Vdbe *in_stack_ffffffffffffffc0;
  u8 *zP4;
  long in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  Vdbe *p;
  
  p = in_RDI->pVdbe;
  if ((*(uint *)(in_RSI + 4) & 0x400) == 0) {
    zP4 = *(u8 **)(in_RSI + 8);
    p1 = sqlite3DecOrHexToI64((char *)CONCAT44(in_EDX,in_ECX),(i64 *)p);
    if ((((p1 == 3) && (in_EDX == 0)) || (p1 == 2)) ||
       ((in_EDX != 0 && (in_stack_ffffffffffffffd0 == -0x8000000000000000)))) {
      iVar1 = sqlite3_strnicmp((char *)zP4,"0x",2);
      if (iVar1 == 0) {
        pcVar2 = "";
        if (in_EDX != 0) {
          pcVar2 = "-";
        }
        sqlite3ErrorMsg(in_RDI,"hex literal too big: %s%s",pcVar2,zP4);
      }
      else {
        codeReal(p,(char *)CONCAT44(in_stack_ffffffffffffffdc,p1),
                 (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0);
      }
    }
    else {
      if (in_EDX != 0) {
        if (p1 == 3) {
          in_stack_ffffffffffffffd0 = -0x8000000000000000;
        }
        else {
          in_stack_ffffffffffffffd0 = -in_stack_ffffffffffffffd0;
        }
      }
      sqlite3VdbeAddOp4Dup8
                (p,in_stack_ffffffffffffffdc,p1,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                 (int)in_stack_ffffffffffffffd0,zP4,(int)in_RSI);
    }
  }
  else {
    sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                      0);
  }
  return;
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3DecOrHexToI64(z, &value);
    if( (c==3 && !negFlag) || (c==2) || (negFlag && value==SMALLEST_INT64)){
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%s", negFlag ? "-" : "", z);
#else
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( sqlite3_strnicmp(z,"0x",2)==0 ){
        sqlite3ErrorMsg(pParse, "hex literal too big: %s%s", negFlag?"-":"",z);
      }else
#endif
      {
        codeReal(v, z, negFlag, iMem);
      }
#endif
    }else{
      if( negFlag ){ value = c==3 ? SMALLEST_INT64 : -value; }
      sqlite3VdbeAddOp4Dup8(v, OP_Int64, 0, iMem, 0, (u8*)&value, P4_INT64);
    }
  }
}